

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void HRSS_poly3_mul(poly3 *out,poly3 *x,poly3 *y)

{
  crypto_word_t v_a;
  crypto_word_t v_s;
  size_t i;
  poly3_span y_span;
  poly3_span x_span;
  poly3_span scratch_span;
  poly3_span prod_span;
  crypto_word_t scratch_a [24];
  crypto_word_t scratch_s [24];
  crypto_word_t prod_a [22];
  crypto_word_t prod_s [22];
  poly3 *y_local;
  poly3 *x_local;
  poly3 *out_local;
  
  scratch_span.a = prod_a + 0x15;
  prod_span.s = scratch_s + 0x17;
  x_span.a = scratch_a + 0x17;
  scratch_span.s = (crypto_word_t *)&prod_span.a;
  x_span.s = (x->a).v;
  y_span.s = (y->a).v;
  i = (size_t)y;
  y_span.a = (crypto_word_t *)x;
  poly3_mul_aux((poly3_span *)&scratch_span.a,(poly3_span *)&x_span.a,(poly3_span *)&y_span.a,
                (poly3_span *)&i,0xb);
  for (v_s = 0; v_s < 0xb; v_s = v_s + 1) {
    poly3_word_add((out->s).v + v_s,(out->a).v + v_s,prod_a[v_s + 0x15],scratch_s[v_s + 0x17],
                   prod_a[v_s + 0x20] << 3 | prod_a[v_s + 0x1f] >> 0x3d,
                   scratch_s[v_s + 0x22] << 3 | scratch_s[v_s + 0x21] >> 0x3d);
  }
  poly3_mod_phiN(out);
  return;
}

Assistant:

void HRSS_poly3_mul(struct poly3 *out, const struct poly3 *x,
                    const struct poly3 *y) {
  crypto_word_t prod_s[WORDS_PER_POLY * 2];
  crypto_word_t prod_a[WORDS_PER_POLY * 2];
  crypto_word_t scratch_s[WORDS_PER_POLY * 2 + 2];
  crypto_word_t scratch_a[WORDS_PER_POLY * 2 + 2];
  const struct poly3_span prod_span = {prod_s, prod_a};
  const struct poly3_span scratch_span = {scratch_s, scratch_a};
  const struct poly3_span x_span = {(crypto_word_t *)x->s.v,
                                    (crypto_word_t *)x->a.v};
  const struct poly3_span y_span = {(crypto_word_t *)y->s.v,
                                    (crypto_word_t *)y->a.v};

  poly3_mul_aux(&prod_span, &scratch_span, &x_span, &y_span, WORDS_PER_POLY);

  // |prod| needs to be reduced mod (𝑥^n - 1), which just involves adding the
  // upper-half to the lower-half. However, N is 701, which isn't a multiple of
  // BITS_PER_WORD, so the upper-half vectors all have to be shifted before
  // being added to the lower-half.
  for (size_t i = 0; i < WORDS_PER_POLY; i++) {
    crypto_word_t v_s = prod_s[WORDS_PER_POLY + i - 1] >> BITS_IN_LAST_WORD;
    v_s |= prod_s[WORDS_PER_POLY + i] << (BITS_PER_WORD - BITS_IN_LAST_WORD);
    crypto_word_t v_a = prod_a[WORDS_PER_POLY + i - 1] >> BITS_IN_LAST_WORD;
    v_a |= prod_a[WORDS_PER_POLY + i] << (BITS_PER_WORD - BITS_IN_LAST_WORD);

    poly3_word_add(&out->s.v[i], &out->a.v[i], prod_s[i], prod_a[i], v_s, v_a);
  }

  poly3_mod_phiN(out);
}